

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnOpcode(BinaryReaderIR *this,Opcode opcode)

{
  anon_struct_3_3_4b311855_for_features_used *paVar1;
  bool *pbVar2;
  _Elt_pointer puVar3;
  _Head_base<0UL,_wabt::CodeMetadataExpr_*,_false> _Var4;
  _Elt_pointer pEVar5;
  _Map_pointer ppEVar6;
  Result RVar7;
  _Elt_pointer pEVar8;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 aVar9;
  Opcode local_6c;
  _Head_base<0UL,_wabt::CodeMetadataExpr_*,_false> local_68;
  Info local_60;
  
  pEVar8 = (this->code_metadata_queue_).entries.
           super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_6c.enum_ = opcode.enum_;
  if (((this->code_metadata_queue_).entries.
       super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
       ._M_impl.super__Deque_impl_data._M_finish._M_cur != pEVar8) &&
     (pEVar8->func == this->current_func_)) {
    puVar3 = (pEVar8->func_queue).
             super__Deque_base<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>,_std::allocator<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    if ((pEVar8->func_queue).
        super__Deque_base<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>,_std::allocator<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur == puVar3) {
      pEVar5 = (this->code_metadata_queue_).entries.
               super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
               ._M_impl.super__Deque_impl_data._M_start._M_last;
      std::
      deque<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>,_std::allocator<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>_>_>
      ::~deque(&pEVar8->func_queue);
      if (pEVar8 == pEVar5 + -1) {
        operator_delete((this->code_metadata_queue_).entries.
                        super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_first,0x1b8);
        ppEVar6 = (this->code_metadata_queue_).entries.
                  super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_node;
        (this->code_metadata_queue_).entries.
        super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
        ._M_impl.super__Deque_impl_data._M_start._M_node = ppEVar6 + 1;
        pEVar8 = ppEVar6[1];
        (this->code_metadata_queue_).entries.
        super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
        ._M_impl.super__Deque_impl_data._M_start._M_first = pEVar8;
        (this->code_metadata_queue_).entries.
        super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
        ._M_impl.super__Deque_impl_data._M_start._M_last = pEVar8 + 5;
      }
      else {
        pEVar8 = (this->code_metadata_queue_).entries.
                 super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
      }
      (this->code_metadata_queue_).entries.
      super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur = pEVar8;
    }
    else {
      aVar9.offset = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset - 1;
      _Var4._M_head_impl =
           (puVar3->_M_t).
           super___uniq_ptr_impl<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>
           ._M_t.
           super__Tuple_impl<0UL,_wabt::CodeMetadataExpr_*,_std::default_delete<wabt::CodeMetadataExpr>_>
           .super__Head_base<0UL,_wabt::CodeMetadataExpr_*,_false>._M_head_impl;
      if ((pEVar8->func->loc).field_1.field_1.offset +
          ((_Var4._M_head_impl)->super_ExprMixin<(wabt::ExprType)15>).super_Expr.loc.field_1.field_1
          .offset == aVar9.offset) {
        ((_Var4._M_head_impl)->super_ExprMixin<(wabt::ExprType)15>).super_Expr.loc.filename._M_len =
             0;
        ((_Var4._M_head_impl)->super_ExprMixin<(wabt::ExprType)15>).super_Expr.loc.filename._M_str =
             (char *)0x0;
        ((_Var4._M_head_impl)->super_ExprMixin<(wabt::ExprType)15>).super_Expr.loc.field_1.field_1.
        offset = aVar9.offset;
        _Var4._M_head_impl =
             (puVar3->_M_t).
             super___uniq_ptr_impl<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>
             ._M_t.
             super__Tuple_impl<0UL,_wabt::CodeMetadataExpr_*,_std::default_delete<wabt::CodeMetadataExpr>_>
             .super__Head_base<0UL,_wabt::CodeMetadataExpr_*,_false>._M_head_impl;
        (puVar3->_M_t).
        super___uniq_ptr_impl<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>.
        _M_t.
        super__Tuple_impl<0UL,_wabt::CodeMetadataExpr_*,_std::default_delete<wabt::CodeMetadataExpr>_>
        .super__Head_base<0UL,_wabt::CodeMetadataExpr_*,_false>._M_head_impl =
             (CodeMetadataExpr *)0x0;
        std::
        deque<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>,_std::allocator<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>_>_>
        ::pop_front(&pEVar8->func_queue);
        if (_Var4._M_head_impl != (CodeMetadataExpr *)0x0) {
          local_68._M_head_impl = _Var4._M_head_impl;
          RVar7 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                                  &local_68);
          if (local_68._M_head_impl == (CodeMetadataExpr *)0x0) {
            return (Result)RVar7.enum_;
          }
          (*((local_68._M_head_impl)->super_ExprMixin<(wabt::ExprType)15>).super_Expr._vptr_Expr[1])
                    ();
          return (Result)RVar7.enum_;
        }
      }
    }
  }
  Opcode::GetInfo(&local_60,&local_6c);
  paVar1 = &this->module_->features_used;
  paVar1->simd = (bool)(paVar1->simd | local_60.result_type.enum_ == V128);
  Opcode::GetInfo(&local_60,&local_6c);
  pbVar2 = &(this->module_->features_used).threads;
  *pbVar2 = (bool)(*pbVar2 | local_60.prefix == 0xfe);
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnOpcode(Opcode opcode) {
  std::unique_ptr<CodeMetadataExpr> metadata =
      code_metadata_queue_.pop_match(current_func_, GetLocation().offset - 1);
  if (metadata) {
    return AppendExpr(std::move(metadata));
  }
  module_->features_used.simd |= (opcode.GetResultType() == Type::V128);
  module_->features_used.threads |= (opcode.GetPrefix() == 0xfe);
  return Result::Ok;
}